

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall
leveldb::DBImpl::WriteLevel0Table(DBImpl *this,MemTable *mem,VersionEdit *edit,Version *base)

{
  undefined8 uVar1;
  bool bVar2;
  TableCache *table_cache;
  uint64_t uVar3;
  _Rb_tree_const_iterator<unsigned_long> largest;
  Iterator *pIVar4;
  undefined8 uVar5;
  Env *in_RCX;
  undefined1 uVar6;
  string *in_RDX;
  Slice *largest_user_key;
  InternalKey *in_RSI;
  Status *in_RDI;
  Options *in_R8;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar7;
  Slice SVar8;
  FileMetaData *unaff_retaddr;
  CompactionStats stats;
  Slice max_user_key;
  Slice min_user_key;
  int level;
  Iterator *iter;
  FileMetaData meta;
  uint64_t start_micros;
  Status *s;
  Status *rhs;
  MemTable *in_stack_fffffffffffffeb0;
  Status *this_00;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_fffffffffffffed0;
  Logger *info_log;
  CompactionStats local_110;
  Status *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff28;
  int iVar9;
  Version *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff71;
  Status in_stack_ffffffffffffff78;
  uint64_t file;
  undefined4 local_78;
  int in_stack_ffffffffffffff8c;
  VersionEdit *in_stack_ffffffffffffff90;
  Iterator *in_stack_ffffffffffffffc8;
  
  this_00 = in_RDI;
  port::Mutex::AssertHeld((Mutex *)&in_RSI[0x46].rep_._M_string_length);
  table_cache = (TableCache *)(**(code **)(*(long *)(in_RSI->rep_)._M_string_length + 0x98))();
  FileMetaData::FileMetaData((FileMetaData *)in_stack_fffffffffffffeb0);
  uVar3 = VersionSet::NewFileNumber(*(VersionSet **)&in_RSI[0x51].rep_);
  pVar7 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
                    (in_stack_fffffffffffffed0,(value_type_conflict1 *)this_00);
  largest = pVar7.first._M_node;
  uVar6 = pVar7.second;
  pIVar4 = MemTable::NewIterator(in_stack_fffffffffffffeb0);
  Log((Logger *)in_RSI[2].rep_._M_string_length,"Level-0 table #%llu: started",uVar3);
  Status::Status(this_00);
  port::Mutex::Unlock((Mutex *)0x1102bb);
  rhs = (Status *)&stack0xffffffffffffff78;
  BuildTable(in_RDX,in_RCX,in_R8,table_cache,in_stack_ffffffffffffffc8,unaff_retaddr);
  Status::operator=((Status *)in_stack_fffffffffffffeb0,rhs);
  Status::~Status((Status *)in_stack_fffffffffffffeb0);
  port::Mutex::Lock((Mutex *)0x11032d);
  info_log = (Logger *)in_RSI[2].rep_._M_string_length;
  uVar1 = CONCAT44(in_stack_ffffffffffffff8c,local_78);
  file = uVar3;
  Status::ToString_abi_cxx11_(in_stack_ffffffffffffff08);
  uVar5 = std::__cxx11::string::c_str();
  Log(info_log,"Level-0 table #%llu: %lld bytes %s",uVar3,uVar1,uVar5);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
  if (pIVar4 != (Iterator *)0x0) {
    (*pIVar4->_vptr_Iterator[1])();
  }
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::erase
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffeb0,(key_type *)rhs);
  iVar9 = 0;
  bVar2 = Status::ok(this_00);
  if ((bVar2) && (CONCAT44(in_stack_ffffffffffffff8c,local_78) != 0)) {
    SVar8 = InternalKey::user_key(in_RSI);
    largest_user_key = (Slice *)SVar8.size_;
    InternalKey::user_key(in_RSI);
    if (in_R8 != (Options *)0x0) {
      iVar9 = Version::PickLevelForMemTableOutput
                        (in_stack_ffffffffffffff30,
                         (Slice *)CONCAT44(iVar9,in_stack_ffffffffffffff28),largest_user_key);
    }
    VersionEdit::AddFile
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,file,
               (uint64_t)in_stack_ffffffffffffff78.state_,
               (InternalKey *)CONCAT71(in_stack_ffffffffffffff71,uVar6),
               (InternalKey *)largest._M_node);
  }
  CompactionStats::CompactionStats(&local_110);
  local_110.micros = (**(code **)(*(long *)(in_RSI->rep_)._M_string_length + 0x98))();
  local_110.micros = local_110.micros - (long)table_cache;
  CompactionStats::Add
            ((CompactionStats *)((long)&in_RSI[0x51].rep_.field_2 + (long)iVar9 * 0x18),&local_110);
  FileMetaData::~FileMetaData((FileMetaData *)in_stack_fffffffffffffeb0);
  return (Status)(char *)in_RDI;
}

Assistant:

Status DBImpl::WriteLevel0Table(MemTable* mem, VersionEdit* edit,
                                Version* base) {
  mutex_.AssertHeld();
  const uint64_t start_micros = env_->NowMicros();
  FileMetaData meta;
  meta.number = versions_->NewFileNumber();
  pending_outputs_.insert(meta.number);
  Iterator* iter = mem->NewIterator();
  Log(options_.info_log, "Level-0 table #%llu: started",
      (unsigned long long)meta.number);

  Status s;
  {
    mutex_.Unlock();
    s = BuildTable(dbname_, env_, options_, table_cache_, iter, &meta);
    mutex_.Lock();
  }

  Log(options_.info_log, "Level-0 table #%llu: %lld bytes %s",
      (unsigned long long)meta.number, (unsigned long long)meta.file_size,
      s.ToString().c_str());
  delete iter;
  pending_outputs_.erase(meta.number);

  // Note that if file_size is zero, the file has been deleted and
  // should not be added to the manifest.
  int level = 0;
  if (s.ok() && meta.file_size > 0) {
    const Slice min_user_key = meta.smallest.user_key();
    const Slice max_user_key = meta.largest.user_key();
    if (base != nullptr) {
      level = base->PickLevelForMemTableOutput(min_user_key, max_user_key);
    }
    edit->AddFile(level, meta.number, meta.file_size, meta.smallest,
                  meta.largest);
  }

  CompactionStats stats;
  stats.micros = env_->NowMicros() - start_micros;
  stats.bytes_written = meta.file_size;
  stats_[level].Add(stats);
  return s;
}